

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyHashInsert(SyHash *pHash,void *pKey,sxu32 nKeyLen,void *pUserData)

{
  sxu32 sVar1;
  SyHashEntry_Pr *pEntry_00;
  sxi32 rc;
  SyHashEntry_Pr *pEntry;
  void *pUserData_local;
  sxu32 nKeyLen_local;
  void *pKey_local;
  SyHash *pHash_local;
  
  if ((pHash->nEntry < pHash->nBucketSize * 3) ||
     (pHash_local._4_4_ = HashGrowTable(pHash), pHash_local._4_4_ == 0)) {
    pEntry_00 = (SyHashEntry_Pr *)SyMemBackendPoolAlloc(pHash->pAllocator,0x48);
    if (pEntry_00 == (SyHashEntry_Pr *)0x0) {
      pHash_local._4_4_ = -1;
    }
    else {
      SyZero(pEntry_00,0x48);
      pEntry_00->pHash = pHash;
      pEntry_00->pKey = pKey;
      pEntry_00->nKeyLen = nKeyLen;
      pEntry_00->pUserData = pUserData;
      sVar1 = (*pHash->xHash)(pEntry_00->pKey,pEntry_00->nKeyLen);
      pEntry_00->nHash = sVar1;
      pHash_local._4_4_ = HashInsert(pHash,pEntry_00);
    }
  }
  return pHash_local._4_4_;
}

Assistant:

JX9_PRIVATE sxi32 SyHashInsert(SyHash *pHash, const void *pKey, sxu32 nKeyLen, void *pUserData)
{
	SyHashEntry_Pr *pEntry;
	sxi32 rc;
#if defined(UNTRUST)
	if( INVALID_HASH(pHash) || pKey == 0 ){
		return SXERR_CORRUPT;
	}
#endif
	if( pHash->nEntry >= pHash->nBucketSize * SXHASH_FILL_FACTOR ){
		rc = HashGrowTable(&(*pHash));
		if( rc != SXRET_OK ){
			return rc;
		}
	}
	/* Allocate a new hash entry */
	pEntry = (SyHashEntry_Pr *)SyMemBackendPoolAlloc(pHash->pAllocator, sizeof(SyHashEntry_Pr));
	if( pEntry == 0 ){
		return SXERR_MEM;
	}
	/* Zero the entry */
	SyZero(pEntry, sizeof(SyHashEntry_Pr));
	pEntry->pHash = pHash;
	pEntry->pKey = pKey;
	pEntry->nKeyLen = nKeyLen;
	pEntry->pUserData = pUserData;
	pEntry->nHash = pHash->xHash(pEntry->pKey, pEntry->nKeyLen);
	/* Finally insert the entry in its corresponding bucket */
	rc = HashInsert(&(*pHash), pEntry);
	return rc;
}